

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libtelnet.c
# Opt level: O0

void telnet_send(telnet_t *telnet,char *buffer,size_t size)

{
  size_t in_RCX;
  size_t local_30;
  size_t l;
  size_t i;
  size_t size_local;
  char *buffer_local;
  telnet_t *telnet_local;
  
  local_30 = 0;
  for (l = 0; l != size; l = l + 1) {
    in_RCX = l;
    if (buffer[l] == -1) {
      if (l != local_30) {
        _send((int)telnet,buffer + local_30,l - local_30,(int)l);
      }
      local_30 = l + 1;
      telnet_iac(telnet,0xff);
    }
  }
  if (l != local_30) {
    _send((int)telnet,buffer + local_30,l - local_30,(int)in_RCX);
  }
  return;
}

Assistant:

void telnet_send(telnet_t *telnet, const char *buffer,
		size_t size) {
	size_t i, l;

	for (l = i = 0; i != size; ++i) {
		/* dump prior portion of text, send escaped bytes */
		if (buffer[i] == (char)TELNET_IAC) {
			/* dump prior text if any */
			if (i != l) {
				_send(telnet, buffer + l, i - l);
			}
			l = i + 1;

			/* send escape */
			telnet_iac(telnet, TELNET_IAC);
		}
	}

	/* send whatever portion of buffer is left */
	if (i != l) {
		_send(telnet, buffer + l, i - l);
	}
}